

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  ulong uVar11;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [32];
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar31;
  float fVar33;
  float fVar35;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar28 [32];
  float fVar32;
  float fVar34;
  float fVar36;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar53;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar54 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 in_ZMM2 [64];
  undefined1 auVar73 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  v4sf one;
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar66 [32];
  undefined1 auVar72 [32];
  
  uVar14 = bottom_top_blob->c;
  uVar16 = (ulong)uVar14;
  uVar15 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar14) {
      auVar122 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar118 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      uVar11 = 0;
      auVar82._8_4_ = 0x3f800000;
      auVar82._0_8_ = 0x3f8000003f800000;
      auVar82._12_4_ = 0x3f800000;
      auVar82._16_4_ = 0x3f800000;
      auVar82._20_4_ = 0x3f800000;
      auVar82._24_4_ = 0x3f800000;
      auVar82._28_4_ = 0x3f800000;
      auVar97 = ZEXT3264(CONCAT428(0x807fffff,
                                   CONCAT424(0x807fffff,
                                             CONCAT420(0x807fffff,
                                                       CONCAT416(0x807fffff,
                                                                 CONCAT412(0x807fffff,
                                                                           CONCAT48(0x807fffff,
                                                                                                                                                                        
                                                  0x807fffff807fffff)))))));
      auVar73 = ZEXT3264(CONCAT428(0x3f3504f3,
                                   CONCAT424(0x3f3504f3,
                                             CONCAT420(0x3f3504f3,
                                                       CONCAT416(0x3f3504f3,
                                                                 CONCAT412(0x3f3504f3,
                                                                           CONCAT48(0x3f3504f3,
                                                                                                                                                                        
                                                  0x3f3504f33f3504f3)))))));
      do {
        if (0 < (int)uVar15) {
          pauVar17 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar14 = uVar15;
          do {
            auVar2 = *pauVar17;
            auVar103._8_4_ = 0x42b0c0a5;
            auVar103._0_8_ = 0x42b0c0a542b0c0a5;
            auVar103._12_4_ = 0x42b0c0a5;
            auVar103._16_4_ = 0x42b0c0a5;
            auVar103._20_4_ = 0x42b0c0a5;
            auVar103._24_4_ = 0x42b0c0a5;
            auVar103._28_4_ = 0x42b0c0a5;
            auVar1 = vminps_avx(auVar103,auVar2);
            auVar113 = auVar122._0_32_;
            auVar28 = vmaxps_avx(auVar113,auVar1);
            fVar19 = auVar118._0_4_;
            auVar114._0_4_ = auVar28._0_4_ * 1.442695 + fVar19;
            fVar31 = auVar118._4_4_;
            auVar114._4_4_ = auVar28._4_4_ * 1.442695 + fVar31;
            fVar33 = auVar118._8_4_;
            auVar114._8_4_ = auVar28._8_4_ * 1.442695 + fVar33;
            fVar35 = auVar118._12_4_;
            auVar114._12_4_ = auVar28._12_4_ * 1.442695 + fVar35;
            fVar74 = auVar118._16_4_;
            auVar114._16_4_ = auVar28._16_4_ * 1.442695 + fVar74;
            fVar75 = auVar118._20_4_;
            auVar114._20_4_ = auVar28._20_4_ * 1.442695 + fVar75;
            fVar76 = auVar118._24_4_;
            auVar114._24_4_ = auVar28._24_4_ * 1.442695 + fVar76;
            fVar53 = auVar118._28_4_;
            auVar114._28_4_ = auVar122._28_4_ + fVar53;
            auVar47 = vroundps_avx(auVar114,1);
            auVar1 = vcmpps_avx(auVar114,auVar47,1);
            auVar1 = vandps_avx(auVar1,auVar82);
            auVar47 = vsubps_avx(auVar47,auVar1);
            auVar3._4_4_ = auVar47._4_4_ * 0.6931472;
            auVar3._0_4_ = auVar47._0_4_ * 0.6931472;
            auVar3._8_4_ = auVar47._8_4_ * 0.6931472;
            auVar3._12_4_ = auVar47._12_4_ * 0.6931472;
            auVar3._16_4_ = auVar47._16_4_ * 0.6931472;
            auVar3._20_4_ = auVar47._20_4_ * 0.6931472;
            auVar3._24_4_ = auVar47._24_4_ * 0.6931472;
            auVar3._28_4_ = auVar1._28_4_;
            auVar1 = vsubps_avx(auVar28,auVar3);
            fVar20 = auVar1._0_4_;
            fVar32 = auVar1._4_4_;
            fVar34 = auVar1._8_4_;
            fVar36 = auVar1._12_4_;
            fVar37 = auVar1._16_4_;
            fVar38 = auVar1._20_4_;
            fVar39 = auVar1._24_4_;
            auVar56._0_4_ = (int)auVar47._0_4_;
            auVar56._4_4_ = (int)auVar47._4_4_;
            auVar56._8_4_ = (int)auVar47._8_4_;
            auVar56._12_4_ = (int)auVar47._12_4_;
            auVar46._16_4_ = (int)auVar47._16_4_;
            auVar46._0_16_ = auVar56;
            auVar46._20_4_ = (int)auVar47._20_4_;
            auVar46._24_4_ = (int)auVar47._24_4_;
            auVar46._28_4_ = (int)auVar47._28_4_;
            auVar108 = vpslld_avx(auVar56,0x17);
            auVar56 = vpslld_avx(auVar46._16_16_,0x17);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar56 = vpaddd_avx(auVar98,auVar56);
            auVar99._8_4_ = 0x3f800000;
            auVar99._0_8_ = 0x3f8000003f800000;
            auVar99._12_4_ = 0x3f800000;
            auVar108 = vpaddd_avx(auVar99,auVar108);
            auVar115._0_4_ =
                 (fVar20 + 1.0 +
                 fVar20 * fVar20 *
                 (fVar19 + ((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) *
                             fVar20 + 0.041665796) * fVar20 + 0.16666666) * fVar20)) *
                 auVar108._0_4_ + 1.0;
            auVar115._4_4_ =
                 (fVar32 + 1.0 +
                 fVar32 * fVar32 *
                 (fVar31 + ((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) *
                             fVar32 + 0.041665796) * fVar32 + 0.16666666) * fVar32)) *
                 auVar108._4_4_ + 1.0;
            auVar115._8_4_ =
                 (fVar34 + 1.0 +
                 fVar34 * fVar34 *
                 (fVar33 + ((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) *
                             fVar34 + 0.041665796) * fVar34 + 0.16666666) * fVar34)) *
                 auVar108._8_4_ + 1.0;
            auVar115._12_4_ =
                 (fVar36 + 1.0 +
                 fVar36 * fVar36 *
                 (fVar35 + ((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) *
                             fVar36 + 0.041665796) * fVar36 + 0.16666666) * fVar36)) *
                 auVar108._12_4_ + 1.0;
            auVar115._16_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (fVar74 + ((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                             fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37)) * auVar56._0_4_
                 + 1.0;
            auVar115._20_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (fVar75 + ((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) *
                             fVar38 + 0.041665796) * fVar38 + 0.16666666) * fVar38)) * auVar56._4_4_
                 + 1.0;
            auVar115._24_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (fVar76 + ((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                             fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39)) * auVar56._8_4_
                 + 1.0;
            auVar115._28_4_ =
                 auVar1._28_4_ + 1.0 +
                 fVar53 + in_ZMM2._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                 1.0;
            auVar28._8_4_ = 0x800000;
            auVar28._0_8_ = 0x80000000800000;
            auVar28._12_4_ = 0x800000;
            auVar28._16_4_ = 0x800000;
            auVar28._20_4_ = 0x800000;
            auVar28._24_4_ = 0x800000;
            auVar28._28_4_ = 0x800000;
            auVar47 = vmaxps_avx(auVar115,auVar28);
            auVar56 = vpsrld_avx(auVar47._16_16_,0x17);
            auVar1 = vandps_avx(auVar47,auVar97._0_32_);
            auVar3 = vorps_avx(auVar118._0_32_,auVar1);
            auVar28 = vcmpps_avx(auVar73._0_32_,auVar3,2);
            auVar1 = vandnps_avx(auVar28,auVar3);
            fVar20 = auVar1._0_4_ + auVar3._0_4_ + -1.0;
            fVar32 = auVar1._4_4_ + auVar3._4_4_ + -1.0;
            fVar34 = auVar1._8_4_ + auVar3._8_4_ + -1.0;
            fVar36 = auVar1._12_4_ + auVar3._12_4_ + -1.0;
            fVar37 = auVar1._16_4_ + auVar3._16_4_ + -1.0;
            fVar38 = auVar1._20_4_ + auVar3._20_4_ + -1.0;
            fVar39 = auVar1._24_4_ + auVar3._24_4_ + -1.0;
            auVar56 = vpsubd_avx(auVar56,auVar28._16_16_);
            auVar108 = vpsrld_avx(auVar47._0_16_,0x17);
            auVar109._8_4_ = 0xffffff81;
            auVar109._0_8_ = 0xffffff81ffffff81;
            auVar109._12_4_ = 0xffffff81;
            auVar56 = vpaddd_avx(auVar56,auVar109);
            auVar108 = vpsubd_avx(auVar108,auVar28._0_16_);
            auVar108 = vpaddd_avx(auVar108,auVar109);
            auVar47._16_16_ = auVar56;
            auVar47._0_16_ = auVar108;
            auVar28 = vcmpps_avx(auVar115,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar118 = ZEXT3264(auVar118._0_32_);
            auVar47 = vcvtdq2ps_avx(auVar47);
            auVar4._4_4_ = (auVar47._4_4_ * 0.6931472 + fVar32 +
                           fVar32 * fVar32 *
                           (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) *
                                  fVar32 + -0.12420141) * fVar32 + 0.14249323) * fVar32 +
                               -0.16668057) * fVar32 + 0.20000714) * fVar32 + -0.24999994) * fVar32
                            + 0.3333333) * fVar32 + -0.5)) * -2.0;
            auVar4._0_4_ = (auVar47._0_4_ * 0.6931472 + fVar20 +
                           fVar20 * fVar20 *
                           (((((((((fVar20 * 0.070376836 + -0.1151461) * fVar20 + 0.116769984) *
                                  fVar20 + -0.12420141) * fVar20 + 0.14249323) * fVar20 +
                               -0.16668057) * fVar20 + 0.20000714) * fVar20 + -0.24999994) * fVar20
                            + 0.3333333) * fVar20 + -0.5)) * -2.0;
            auVar4._8_4_ = (auVar47._8_4_ * 0.6931472 + fVar34 +
                           fVar34 * fVar34 *
                           (((((((((fVar34 * 0.070376836 + -0.1151461) * fVar34 + 0.116769984) *
                                  fVar34 + -0.12420141) * fVar34 + 0.14249323) * fVar34 +
                               -0.16668057) * fVar34 + 0.20000714) * fVar34 + -0.24999994) * fVar34
                            + 0.3333333) * fVar34 + -0.5)) * -2.0;
            auVar4._12_4_ =
                 (auVar47._12_4_ * 0.6931472 + fVar36 +
                 fVar36 * fVar36 *
                 (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                       -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 +
                    0.20000714) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5)) *
                 -2.0;
            auVar4._16_4_ =
                 (auVar47._16_4_ * 0.6931472 + fVar37 +
                 fVar37 * fVar37 *
                 (((((((((fVar37 * 0.070376836 + -0.1151461) * fVar37 + 0.116769984) * fVar37 +
                       -0.12420141) * fVar37 + 0.14249323) * fVar37 + -0.16668057) * fVar37 +
                    0.20000714) * fVar37 + -0.24999994) * fVar37 + 0.3333333) * fVar37 + -0.5)) *
                 -2.0;
            auVar4._20_4_ =
                 (auVar47._20_4_ * 0.6931472 + fVar38 +
                 fVar38 * fVar38 *
                 (((((((((fVar38 * 0.070376836 + -0.1151461) * fVar38 + 0.116769984) * fVar38 +
                       -0.12420141) * fVar38 + 0.14249323) * fVar38 + -0.16668057) * fVar38 +
                    0.20000714) * fVar38 + -0.24999994) * fVar38 + 0.3333333) * fVar38 + -0.5)) *
                 -2.0;
            auVar4._24_4_ =
                 (auVar47._24_4_ * 0.6931472 + fVar39 +
                 fVar39 * fVar39 *
                 (((((((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) * fVar39 +
                       -0.12420141) * fVar39 + 0.14249323) * fVar39 + -0.16668057) * fVar39 +
                    0.20000714) * fVar39 + -0.24999994) * fVar39 + 0.3333333) * fVar39 + -0.5)) *
                 -2.0;
            auVar4._28_4_ = auVar47._28_4_ + auVar1._28_4_ + auVar3._28_4_ + -1.0 + 0.0;
            auVar48._8_4_ = 0x7fffffff;
            auVar48._0_8_ = 0x7fffffff7fffffff;
            auVar48._12_4_ = 0x7fffffff;
            auVar48._16_4_ = 0x7fffffff;
            auVar48._20_4_ = 0x7fffffff;
            auVar48._24_4_ = 0x7fffffff;
            auVar48._28_4_ = 0x7fffffff;
            auVar1 = vblendvps_avx(auVar4,auVar48,auVar28);
            auVar1 = vminps_avx(auVar103,auVar1);
            auVar122 = ZEXT3264(auVar113);
            auVar28 = vmaxps_avx(auVar113,auVar1);
            auVar49._0_4_ = fVar19 + auVar28._0_4_ * 1.442695;
            auVar49._4_4_ = fVar31 + auVar28._4_4_ * 1.442695;
            auVar49._8_4_ = fVar33 + auVar28._8_4_ * 1.442695;
            auVar49._12_4_ = fVar35 + auVar28._12_4_ * 1.442695;
            auVar49._16_4_ = fVar74 + auVar28._16_4_ * 1.442695;
            auVar49._20_4_ = fVar75 + auVar28._20_4_ * 1.442695;
            auVar49._24_4_ = fVar76 + auVar28._24_4_ * 1.442695;
            auVar49._28_4_ = fVar53 + NAN;
            auVar47 = vroundps_avx(auVar49,1);
            auVar1 = vcmpps_avx(auVar49,auVar47,1);
            auVar1 = vandps_avx(auVar1,auVar82);
            auVar1 = vsubps_avx(auVar47,auVar1);
            auVar113._4_4_ = auVar1._4_4_ * 0.6931472;
            auVar113._0_4_ = auVar1._0_4_ * 0.6931472;
            auVar113._8_4_ = auVar1._8_4_ * 0.6931472;
            auVar113._12_4_ = auVar1._12_4_ * 0.6931472;
            auVar113._16_4_ = auVar1._16_4_ * 0.6931472;
            auVar113._20_4_ = auVar1._20_4_ * 0.6931472;
            auVar113._24_4_ = auVar1._24_4_ * 0.6931472;
            auVar113._28_4_ = auVar47._28_4_;
            auVar28 = vsubps_avx(auVar28,auVar113);
            fVar53 = auVar28._0_4_;
            fVar20 = auVar28._4_4_;
            fVar32 = auVar28._8_4_;
            fVar34 = auVar28._12_4_;
            fVar36 = auVar28._16_4_;
            fVar37 = auVar28._20_4_;
            fVar38 = auVar28._24_4_;
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar73 = ZEXT3264(CONCAT428(0x3f3504f3,
                                         CONCAT424(0x3f3504f3,
                                                   CONCAT420(0x3f3504f3,
                                                             CONCAT416(0x3f3504f3,
                                                                       CONCAT412(0x3f3504f3,
                                                                                 CONCAT48(0x3f3504f3
                                                                                          ,
                                                  0x3f3504f33f3504f3)))))));
            auVar97 = ZEXT3264(CONCAT428(0x807fffff,
                                         CONCAT424(0x807fffff,
                                                   CONCAT420(0x807fffff,
                                                             CONCAT416(0x807fffff,
                                                                       CONCAT412(0x807fffff,
                                                                                 CONCAT48(0x807fffff
                                                                                          ,
                                                  0x807fffff807fffff)))))));
            auVar108._0_4_ = (int)auVar1._0_4_;
            auVar108._4_4_ = (int)auVar1._4_4_;
            auVar108._8_4_ = (int)auVar1._8_4_;
            auVar108._12_4_ = (int)auVar1._12_4_;
            auVar50._16_4_ = (int)auVar1._16_4_;
            auVar50._0_16_ = auVar108;
            auVar50._20_4_ = (int)auVar1._20_4_;
            auVar50._24_4_ = (int)auVar1._24_4_;
            auVar50._28_4_ = (int)auVar1._28_4_;
            auVar108 = vpslld_avx(auVar108,0x17);
            auVar56 = vpslld_avx(auVar50._16_16_,0x17);
            auVar56 = vpaddd_avx(auVar56,auVar94);
            auVar108 = vpaddd_avx(auVar108,auVar94);
            auVar96._8_4_ = 0x40000000;
            auVar96._0_8_ = 0x4000000040000000;
            auVar96._12_4_ = 0x40000000;
            auVar96._16_4_ = 0x40000000;
            auVar96._20_4_ = 0x40000000;
            auVar96._24_4_ = 0x40000000;
            auVar96._28_4_ = 0x40000000;
            auVar29._0_4_ =
                 (fVar53 + 1.0 +
                 fVar53 * fVar53 *
                 (fVar19 + ((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) *
                             fVar53 + 0.041665796) * fVar53 + 0.16666666) * fVar53)) *
                 auVar108._0_4_ + 1.0;
            auVar29._4_4_ =
                 (fVar20 + 1.0 +
                 fVar20 * fVar20 *
                 (fVar31 + ((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) *
                             fVar20 + 0.041665796) * fVar20 + 0.16666666) * fVar20)) *
                 auVar108._4_4_ + 1.0;
            auVar29._8_4_ =
                 (fVar32 + 1.0 +
                 fVar32 * fVar32 *
                 (fVar33 + ((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) *
                             fVar32 + 0.041665796) * fVar32 + 0.16666666) * fVar32)) *
                 auVar108._8_4_ + 1.0;
            auVar29._12_4_ =
                 (fVar34 + 1.0 +
                 fVar34 * fVar34 *
                 (fVar35 + ((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) *
                             fVar34 + 0.041665796) * fVar34 + 0.16666666) * fVar34)) *
                 auVar108._12_4_ + 1.0;
            auVar29._16_4_ =
                 (fVar36 + 1.0 +
                 fVar36 * fVar36 *
                 (fVar74 + ((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) *
                             fVar36 + 0.041665796) * fVar36 + 0.16666666) * fVar36)) * auVar56._0_4_
                 + 1.0;
            auVar29._20_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (fVar75 + ((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) *
                             fVar37 + 0.041665796) * fVar37 + 0.16666666) * fVar37)) * auVar56._4_4_
                 + 1.0;
            auVar29._24_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (fVar76 + ((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) *
                             fVar38 + 0.041665796) * fVar38 + 0.16666666) * fVar38)) * auVar56._8_4_
                 + 1.0;
            auVar29._28_4_ = auVar28._28_4_ + 1.0 + auVar47._28_4_ + 1.0;
            auVar1 = vrcpps_avx(auVar29);
            fVar19 = auVar1._0_4_;
            fVar53 = fVar19 + fVar19;
            fVar31 = auVar1._4_4_;
            fVar20 = fVar31 + fVar31;
            fVar33 = auVar1._8_4_;
            fVar32 = fVar33 + fVar33;
            fVar35 = auVar1._12_4_;
            fVar34 = fVar35 + fVar35;
            fVar74 = auVar1._16_4_;
            fVar36 = fVar74 + fVar74;
            fVar75 = auVar1._20_4_;
            fVar37 = fVar75 + fVar75;
            fVar76 = auVar1._24_4_;
            fVar38 = fVar76 + fVar76;
            fVar39 = auVar1._28_4_ + auVar1._28_4_;
            in_ZMM2 = ZEXT3264(CONCAT428(fVar39,CONCAT424(fVar38,CONCAT420(fVar37,CONCAT416(fVar36,
                                                  CONCAT412(fVar34,CONCAT48(fVar32,CONCAT44(fVar20,
                                                  fVar53))))))));
            auVar1._4_4_ = auVar29._4_4_ * fVar20;
            auVar1._0_4_ = auVar29._0_4_ * fVar53;
            auVar1._8_4_ = auVar29._8_4_ * fVar32;
            auVar1._12_4_ = auVar29._12_4_ * fVar34;
            auVar1._16_4_ = auVar29._16_4_ * fVar36;
            auVar1._20_4_ = auVar29._20_4_ * fVar37;
            auVar1._24_4_ = auVar29._24_4_ * fVar38;
            auVar1._28_4_ = auVar29._28_4_;
            auVar1 = vsubps_avx(auVar96,auVar1);
            local_58 = auVar2._0_4_;
            fStack_54 = auVar2._4_4_;
            fStack_50 = auVar2._8_4_;
            fStack_4c = auVar2._12_4_;
            fStack_48 = auVar2._16_4_;
            fStack_44 = auVar2._20_4_;
            fStack_40 = auVar2._24_4_;
            auVar2._4_4_ = (fVar20 + -1.0 + fVar31 * auVar1._4_4_) * fStack_54;
            auVar2._0_4_ = (fVar53 + -1.0 + fVar19 * auVar1._0_4_) * local_58;
            auVar2._8_4_ = (fVar32 + -1.0 + fVar33 * auVar1._8_4_) * fStack_50;
            auVar2._12_4_ = (fVar34 + -1.0 + fVar35 * auVar1._12_4_) * fStack_4c;
            auVar2._16_4_ = (fVar36 + -1.0 + fVar74 * auVar1._16_4_) * fStack_48;
            auVar2._20_4_ = (fVar37 + -1.0 + fVar75 * auVar1._20_4_) * fStack_44;
            auVar2._24_4_ = (fVar38 + -1.0 + fVar76 * auVar1._24_4_) * fStack_40;
            auVar2._28_4_ = fVar39 + -1.0 + auVar1._28_4_;
            *pauVar17 = auVar2;
            pauVar17 = pauVar17 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar16);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar14) {
      uVar11 = 0;
      auVar122 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar73 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar85._8_4_ = 0x3f000000;
      auVar85._0_8_ = 0x3f0000003f000000;
      auVar85._12_4_ = 0x3f000000;
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = 0x3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar97 = ZEXT1664(CONCAT412(0x800000,CONCAT48(0x800000,0x80000000800000)));
      do {
        if (0 < (int)uVar15) {
          pauVar13 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar14 = uVar15;
          do {
            auVar56 = *pauVar13;
            auVar99 = auVar122._0_16_;
            auVar108 = vminps_avx(auVar99,auVar56);
            auVar94 = vmaxps_avx(auVar108,auVar73._0_16_);
            auVar119._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar119._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar119._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar119._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar106._0_4_ = (int)auVar119._0_4_;
            auVar106._4_4_ = (int)auVar119._4_4_;
            auVar106._8_4_ = (int)auVar119._8_4_;
            auVar106._12_4_ = (int)auVar119._12_4_;
            auVar109 = vcvtdq2ps_avx(auVar106);
            auVar108 = vcmpps_avx(auVar119,auVar109,1);
            auVar108 = vandps_avx(auVar108,auVar112);
            auVar108 = vsubps_avx(auVar109,auVar108);
            auVar120._0_4_ = auVar108._0_4_ * 0.6931472;
            auVar120._4_4_ = auVar108._4_4_ * 0.6931472;
            auVar120._8_4_ = auVar108._8_4_ * 0.6931472;
            auVar120._12_4_ = auVar108._12_4_ * 0.6931472;
            auVar109 = vsubps_avx(auVar94,auVar120);
            fVar19 = auVar109._0_4_;
            fVar31 = auVar109._4_4_;
            fVar33 = auVar109._8_4_;
            fVar35 = auVar109._12_4_;
            auVar107._0_4_ = (int)auVar108._0_4_;
            auVar107._4_4_ = (int)auVar108._4_4_;
            auVar107._8_4_ = (int)auVar108._8_4_;
            auVar107._12_4_ = (int)auVar108._12_4_;
            auVar108 = vpslld_avx(auVar107,0x17);
            auVar108 = vpaddd_avx(auVar108,auVar112);
            auVar116._0_4_ =
                 auVar108._0_4_ *
                 (fVar19 + 1.0 +
                 fVar19 * fVar19 *
                 (fVar19 * (fVar19 * (fVar19 * (fVar19 * (fVar19 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar116._4_4_ =
                 auVar108._4_4_ *
                 (fVar31 + 1.0 +
                 fVar31 * fVar31 *
                 (fVar31 * (fVar31 * (fVar31 * (fVar31 * (fVar31 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar116._8_4_ =
                 auVar108._8_4_ *
                 (fVar33 + 1.0 +
                 fVar33 * fVar33 *
                 (fVar33 * (fVar33 * (fVar33 * (fVar33 * (fVar33 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar116._12_4_ =
                 auVar108._12_4_ *
                 (fVar35 + 1.0 +
                 fVar35 * fVar35 *
                 (fVar35 * (fVar35 * (fVar35 * (fVar35 * (fVar35 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) +
                 1.0;
            auVar108 = vmaxps_avx(auVar116,auVar97._0_16_);
            auVar109 = vpsrld_avx(auVar108,0x17);
            auVar91._8_4_ = 0xffffff82;
            auVar91._0_8_ = 0xffffff82ffffff82;
            auVar91._12_4_ = 0xffffff82;
            auVar109 = vpaddd_avx(auVar109,auVar91);
            auVar92._8_4_ = 0x807fffff;
            auVar92._0_8_ = 0x807fffff807fffff;
            auVar92._12_4_ = 0x807fffff;
            auVar108 = vandps_avx(auVar108,auVar92);
            auVar98 = vorps_avx(auVar108,auVar85);
            auVar94 = vcvtdq2ps_avx(auVar109);
            auVar93._8_4_ = 0x3f3504f3;
            auVar93._0_8_ = 0x3f3504f33f3504f3;
            auVar93._12_4_ = 0x3f3504f3;
            auVar109 = vcmpps_avx(auVar98,auVar93,1);
            auVar108 = vandps_avx(auVar109,auVar98);
            fVar19 = auVar98._0_4_ + -1.0 + auVar108._0_4_;
            fVar31 = auVar98._4_4_ + -1.0 + auVar108._4_4_;
            fVar33 = auVar98._8_4_ + -1.0 + auVar108._8_4_;
            fVar35 = auVar98._12_4_ + -1.0 + auVar108._12_4_;
            auVar108 = vandps_avx(auVar109,auVar112);
            auVar109 = vsubps_avx(auVar94,auVar108);
            auVar122 = ZEXT1664(auVar99);
            auVar54._8_4_ = 0xc2b0c0a5;
            auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar54._12_4_ = 0xc2b0c0a5;
            auVar73 = ZEXT1664(auVar54);
            auVar108 = vcmpps_avx(auVar116,ZEXT816(0) << 0x20,2);
            auVar21._0_4_ =
                 (fVar19 * fVar19 *
                  (((((((((fVar19 * 0.070376836 + -0.1151461) * fVar19 + 0.116769984) * fVar19 +
                        -0.12420141) * fVar19 + 0.14249323) * fVar19 + -0.16668057) * fVar19 +
                     0.20000714) * fVar19 + -0.24999994) * fVar19 + 0.3333333) * fVar19 + -0.5) +
                 auVar109._0_4_ * 0.6931472 + fVar19) * -2.0;
            auVar21._4_4_ =
                 (fVar31 * fVar31 *
                  (((((((((fVar31 * 0.070376836 + -0.1151461) * fVar31 + 0.116769984) * fVar31 +
                        -0.12420141) * fVar31 + 0.14249323) * fVar31 + -0.16668057) * fVar31 +
                     0.20000714) * fVar31 + -0.24999994) * fVar31 + 0.3333333) * fVar31 + -0.5) +
                 auVar109._4_4_ * 0.6931472 + fVar31) * -2.0;
            auVar21._8_4_ =
                 (fVar33 * fVar33 *
                  (((((((((fVar33 * 0.070376836 + -0.1151461) * fVar33 + 0.116769984) * fVar33 +
                        -0.12420141) * fVar33 + 0.14249323) * fVar33 + -0.16668057) * fVar33 +
                     0.20000714) * fVar33 + -0.24999994) * fVar33 + 0.3333333) * fVar33 + -0.5) +
                 auVar109._8_4_ * 0.6931472 + fVar33) * -2.0;
            auVar21._12_4_ =
                 (fVar35 * fVar35 *
                  (((((((((fVar35 * 0.070376836 + -0.1151461) * fVar35 + 0.116769984) * fVar35 +
                        -0.12420141) * fVar35 + 0.14249323) * fVar35 + -0.16668057) * fVar35 +
                     0.20000714) * fVar35 + -0.24999994) * fVar35 + 0.3333333) * fVar35 + -0.5) +
                 auVar109._12_4_ * 0.6931472 + fVar35) * -2.0;
            auVar40._8_4_ = 0x7fffffff;
            auVar40._0_8_ = 0x7fffffff7fffffff;
            auVar40._12_4_ = 0x7fffffff;
            auVar108 = vblendvps_avx(auVar21,auVar40,auVar108);
            auVar108 = vminps_avx(auVar99,auVar108);
            auVar94 = vmaxps_avx(auVar108,auVar54);
            auVar41._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar41._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar41._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar41._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar110._0_4_ = (int)auVar41._0_4_;
            auVar110._4_4_ = (int)auVar41._4_4_;
            auVar110._8_4_ = (int)auVar41._8_4_;
            auVar110._12_4_ = (int)auVar41._12_4_;
            auVar109 = vcvtdq2ps_avx(auVar110);
            auVar108 = vcmpps_avx(auVar41,auVar109,1);
            auVar108 = vandps_avx(auVar112,auVar108);
            auVar108 = vsubps_avx(auVar109,auVar108);
            auVar111._0_4_ = auVar108._0_4_ * 0.6931472;
            auVar111._4_4_ = auVar108._4_4_ * 0.6931472;
            auVar111._8_4_ = auVar108._8_4_ * 0.6931472;
            auVar111._12_4_ = auVar108._12_4_ * 0.6931472;
            auVar109 = vsubps_avx(auVar94,auVar111);
            fVar19 = auVar109._0_4_;
            fVar31 = auVar109._4_4_;
            fVar33 = auVar109._8_4_;
            fVar35 = auVar109._12_4_;
            auVar117._8_4_ = 0x40000000;
            auVar117._0_8_ = 0x4000000040000000;
            auVar117._12_4_ = 0x40000000;
            auVar42._0_4_ = (int)auVar108._0_4_;
            auVar42._4_4_ = (int)auVar108._4_4_;
            auVar42._8_4_ = (int)auVar108._8_4_;
            auVar42._12_4_ = (int)auVar108._12_4_;
            auVar108 = vpslld_avx(auVar42,0x17);
            auVar108 = vpaddd_avx(auVar112,auVar108);
            auVar22._0_4_ =
                 (fVar19 * fVar19 *
                  (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                    0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) + fVar19 + 1.0) *
                 auVar108._0_4_ + 1.0;
            auVar22._4_4_ =
                 (fVar31 * fVar31 *
                  (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                    0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) + fVar31 + 1.0) *
                 auVar108._4_4_ + 1.0;
            auVar22._8_4_ =
                 (fVar33 * fVar33 *
                  (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                    0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5) + fVar33 + 1.0) *
                 auVar108._8_4_ + 1.0;
            auVar22._12_4_ =
                 (fVar35 * fVar35 *
                  (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                    0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5) + fVar35 + 1.0) *
                 auVar108._12_4_ + 1.0;
            auVar108 = vrcpps_avx(auVar22);
            fVar19 = auVar108._0_4_;
            fVar31 = auVar108._4_4_;
            fVar33 = auVar108._8_4_;
            fVar35 = auVar108._12_4_;
            auVar23._0_4_ = (fVar19 + fVar19) * auVar22._0_4_;
            auVar23._4_4_ = (fVar31 + fVar31) * auVar22._4_4_;
            auVar23._8_4_ = (fVar33 + fVar33) * auVar22._8_4_;
            auVar23._12_4_ = (fVar35 + fVar35) * auVar22._12_4_;
            auVar108 = vsubps_avx(auVar117,auVar23);
            auVar97 = ZEXT1664(CONCAT412(0x800000,CONCAT48(0x800000,0x80000000800000)));
            local_58 = auVar56._0_4_;
            fStack_54 = auVar56._4_4_;
            fStack_50 = auVar56._8_4_;
            fStack_4c = auVar56._12_4_;
            auVar24._0_4_ = (fVar19 + fVar19 + -1.0 + fVar19 * auVar108._0_4_) * local_58;
            auVar24._4_4_ = (fVar31 + fVar31 + -1.0 + fVar31 * auVar108._4_4_) * fStack_54;
            auVar24._8_4_ = (fVar33 + fVar33 + -1.0 + fVar33 * auVar108._8_4_) * fStack_50;
            auVar24._12_4_ = (fVar35 + fVar35 + -1.0 + fVar35 * auVar108._12_4_) * fStack_4c;
            *pauVar13 = auVar24;
            pauVar13 = pauVar13 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar16);
    }
  }
  else if (0 < (int)uVar14) {
    uVar11 = 0;
    do {
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar104._8_4_ = 0x3f000000;
      auVar104._0_8_ = 0x3f0000003f000000;
      auVar105._12_4_ = 0x3f800000;
      auVar104._12_4_ = 0x3f000000;
      auVar105._16_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f000000;
      auVar105._20_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f000000;
      auVar105._24_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f000000;
      auVar105._28_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f000000;
      pauVar17 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar15 < 8) {
        uVar14 = 0;
      }
      else {
        iVar10 = 7;
        do {
          auVar82 = *pauVar17;
          auVar30._8_4_ = 0x42b0c0a5;
          auVar30._0_8_ = 0x42b0c0a542b0c0a5;
          auVar30._12_4_ = 0x42b0c0a5;
          auVar30._16_4_ = 0x42b0c0a5;
          auVar30._20_4_ = 0x42b0c0a5;
          auVar30._24_4_ = 0x42b0c0a5;
          auVar30._28_4_ = 0x42b0c0a5;
          auVar2 = vminps_avx(auVar82,auVar30);
          auVar64._8_4_ = 0xc2b0c0a5;
          auVar64._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar64._12_4_ = 0xc2b0c0a5;
          auVar64._16_4_ = 0xc2b0c0a5;
          auVar64._20_4_ = 0xc2b0c0a5;
          auVar64._24_4_ = 0xc2b0c0a5;
          auVar64._28_4_ = 0xc2b0c0a5;
          auVar1 = vmaxps_avx(auVar2,auVar64);
          auVar65._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
          auVar65._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
          auVar65._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
          auVar65._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
          auVar65._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
          auVar65._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
          auVar65._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
          auVar65._28_4_ = 0xc2afc0a5;
          auVar28 = vroundps_avx(auVar65,1);
          auVar2 = vcmpps_avx(auVar65,auVar28,1);
          auVar2 = vandps_avx(auVar105,auVar2);
          auVar2 = vsubps_avx(auVar28,auVar2);
          auVar5._4_4_ = auVar2._4_4_ * 0.6931472;
          auVar5._0_4_ = auVar2._0_4_ * 0.6931472;
          auVar5._8_4_ = auVar2._8_4_ * 0.6931472;
          auVar5._12_4_ = auVar2._12_4_ * 0.6931472;
          auVar5._16_4_ = auVar2._16_4_ * 0.6931472;
          auVar5._20_4_ = auVar2._20_4_ * 0.6931472;
          auVar5._24_4_ = auVar2._24_4_ * 0.6931472;
          auVar5._28_4_ = auVar28._28_4_;
          auVar1 = vsubps_avx(auVar1,auVar5);
          fVar19 = auVar1._0_4_;
          fVar31 = auVar1._4_4_;
          fVar33 = auVar1._8_4_;
          fVar35 = auVar1._12_4_;
          fVar74 = auVar1._16_4_;
          fVar75 = auVar1._20_4_;
          fVar76 = auVar1._24_4_;
          auVar55._0_4_ = (int)auVar2._0_4_;
          auVar55._4_4_ = (int)auVar2._4_4_;
          auVar55._8_4_ = (int)auVar2._8_4_;
          auVar55._12_4_ = (int)auVar2._12_4_;
          auVar66._16_4_ = (int)auVar2._16_4_;
          auVar66._0_16_ = auVar55;
          auVar66._20_4_ = (int)auVar2._20_4_;
          auVar66._24_4_ = (int)auVar2._24_4_;
          auVar66._28_4_ = (int)auVar2._28_4_;
          auVar108 = vpslld_avx(auVar55,0x17);
          auVar56 = vpslld_avx(auVar66._16_16_,0x17);
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar56 = vpaddd_avx(auVar121,auVar56);
          auVar108 = vpaddd_avx(auVar121,auVar108);
          auVar51._0_4_ =
               (fVar19 + 1.0 +
               fVar19 * fVar19 *
               (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar108._0_4_ + 1.0;
          auVar51._4_4_ =
               (fVar31 + 1.0 +
               fVar31 * fVar31 *
               (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar108._4_4_ + 1.0;
          auVar51._8_4_ =
               (fVar33 + 1.0 +
               fVar33 * fVar33 *
               (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                 0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar108._8_4_ + 1.0;
          auVar51._12_4_ =
               (fVar35 + 1.0 +
               fVar35 * fVar35 *
               (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar108._12_4_ + 1.0;
          auVar51._16_4_ =
               (fVar74 + 1.0 +
               fVar74 * fVar74 *
               (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar56._0_4_ + 1.0;
          auVar51._20_4_ =
               (fVar75 + 1.0 +
               fVar75 * fVar75 *
               (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5)) * auVar56._4_4_ + 1.0;
          auVar51._24_4_ =
               (fVar76 + 1.0 +
               fVar76 * fVar76 *
               (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar56._8_4_ + 1.0;
          auVar51._28_4_ = auVar1._28_4_ + 1.0 + auVar28._28_4_ + 1.0;
          auVar67._8_4_ = 0x800000;
          auVar67._0_8_ = 0x80000000800000;
          auVar67._12_4_ = 0x800000;
          auVar67._16_4_ = 0x800000;
          auVar67._20_4_ = 0x800000;
          auVar67._24_4_ = 0x800000;
          auVar67._28_4_ = 0x800000;
          auVar28 = vmaxps_avx(auVar51,auVar67);
          auVar56 = vpsrld_avx(auVar28._16_16_,0x17);
          auVar68._8_4_ = 0x807fffff;
          auVar68._0_8_ = 0x807fffff807fffff;
          auVar68._12_4_ = 0x807fffff;
          auVar68._16_4_ = 0x807fffff;
          auVar68._20_4_ = 0x807fffff;
          auVar68._24_4_ = 0x807fffff;
          auVar68._28_4_ = 0x807fffff;
          auVar2 = vandps_avx(auVar28,auVar68);
          auVar47 = vorps_avx(auVar104,auVar2);
          auVar90._8_4_ = 0x3f3504f3;
          auVar90._0_8_ = 0x3f3504f33f3504f3;
          auVar90._12_4_ = 0x3f3504f3;
          auVar90._16_4_ = 0x3f3504f3;
          auVar90._20_4_ = 0x3f3504f3;
          auVar90._24_4_ = 0x3f3504f3;
          auVar90._28_4_ = 0x3f3504f3;
          auVar1 = vcmpps_avx(auVar90,auVar47,2);
          auVar2 = vandnps_avx(auVar1,auVar47);
          fVar19 = auVar47._0_4_ + -1.0 + auVar2._0_4_;
          fVar31 = auVar47._4_4_ + -1.0 + auVar2._4_4_;
          fVar33 = auVar47._8_4_ + -1.0 + auVar2._8_4_;
          fVar35 = auVar47._12_4_ + -1.0 + auVar2._12_4_;
          fVar74 = auVar47._16_4_ + -1.0 + auVar2._16_4_;
          fVar75 = auVar47._20_4_ + -1.0 + auVar2._20_4_;
          fVar76 = auVar47._24_4_ + -1.0 + auVar2._24_4_;
          auVar56 = vpsubd_avx(auVar56,auVar1._16_16_);
          auVar108 = vpsrld_avx(auVar28._0_16_,0x17);
          auVar100._8_4_ = 0xffffff81;
          auVar100._0_8_ = 0xffffff81ffffff81;
          auVar100._12_4_ = 0xffffff81;
          auVar56 = vpaddd_avx(auVar100,auVar56);
          auVar108 = vpsubd_avx(auVar108,auVar1._0_16_);
          auVar108 = vpaddd_avx(auVar100,auVar108);
          auVar83._16_16_ = auVar56;
          auVar83._0_16_ = auVar108;
          auVar1 = vcmpps_avx(auVar51,_DAT_005181a0,2);
          auVar28 = vcvtdq2ps_avx(auVar83);
          auVar6._4_4_ = (auVar28._4_4_ * 0.6931472 + fVar31 +
                         fVar31 * fVar31 *
                         (((((((((fVar31 * 0.070376836 + -0.1151461) * fVar31 + 0.116769984) *
                                fVar31 + -0.12420141) * fVar31 + 0.14249323) * fVar31 + -0.16668057)
                             * fVar31 + 0.20000714) * fVar31 + -0.24999994) * fVar31 + 0.3333333) *
                          fVar31 + -0.5)) * -2.0;
          auVar6._0_4_ = (auVar28._0_4_ * 0.6931472 + fVar19 +
                         fVar19 * fVar19 *
                         (((((((((fVar19 * 0.070376836 + -0.1151461) * fVar19 + 0.116769984) *
                                fVar19 + -0.12420141) * fVar19 + 0.14249323) * fVar19 + -0.16668057)
                             * fVar19 + 0.20000714) * fVar19 + -0.24999994) * fVar19 + 0.3333333) *
                          fVar19 + -0.5)) * -2.0;
          auVar6._8_4_ = (auVar28._8_4_ * 0.6931472 + fVar33 +
                         fVar33 * fVar33 *
                         (((((((((fVar33 * 0.070376836 + -0.1151461) * fVar33 + 0.116769984) *
                                fVar33 + -0.12420141) * fVar33 + 0.14249323) * fVar33 + -0.16668057)
                             * fVar33 + 0.20000714) * fVar33 + -0.24999994) * fVar33 + 0.3333333) *
                          fVar33 + -0.5)) * -2.0;
          auVar6._12_4_ =
               (auVar28._12_4_ * 0.6931472 + fVar35 +
               fVar35 * fVar35 *
               (((((((((fVar35 * 0.070376836 + -0.1151461) * fVar35 + 0.116769984) * fVar35 +
                     -0.12420141) * fVar35 + 0.14249323) * fVar35 + -0.16668057) * fVar35 +
                  0.20000714) * fVar35 + -0.24999994) * fVar35 + 0.3333333) * fVar35 + -0.5)) * -2.0
          ;
          auVar6._16_4_ =
               (auVar28._16_4_ * 0.6931472 + fVar74 +
               fVar74 * fVar74 *
               (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) * fVar74 +
                     -0.12420141) * fVar74 + 0.14249323) * fVar74 + -0.16668057) * fVar74 +
                  0.20000714) * fVar74 + -0.24999994) * fVar74 + 0.3333333) * fVar74 + -0.5)) * -2.0
          ;
          auVar6._20_4_ =
               (auVar28._20_4_ * 0.6931472 + fVar75 +
               fVar75 * fVar75 *
               (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 + 0.116769984) * fVar75 +
                     -0.12420141) * fVar75 + 0.14249323) * fVar75 + -0.16668057) * fVar75 +
                  0.20000714) * fVar75 + -0.24999994) * fVar75 + 0.3333333) * fVar75 + -0.5)) * -2.0
          ;
          auVar6._24_4_ =
               (auVar28._24_4_ * 0.6931472 + fVar76 +
               fVar76 * fVar76 *
               (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 + 0.116769984) * fVar76 +
                     -0.12420141) * fVar76 + 0.14249323) * fVar76 + -0.16668057) * fVar76 +
                  0.20000714) * fVar76 + -0.24999994) * fVar76 + 0.3333333) * fVar76 + -0.5)) * -2.0
          ;
          auVar6._28_4_ = auVar28._28_4_ + auVar47._28_4_ + -1.0 + auVar2._28_4_ + 0.0;
          auVar84._8_4_ = 0x7fffffff;
          auVar84._0_8_ = 0x7fffffff7fffffff;
          auVar84._12_4_ = 0x7fffffff;
          auVar84._16_4_ = 0x7fffffff;
          auVar84._20_4_ = 0x7fffffff;
          auVar84._24_4_ = 0x7fffffff;
          auVar84._28_4_ = 0x7fffffff;
          auVar2 = vblendvps_avx(auVar6,auVar84,auVar1);
          auVar69._8_4_ = 0x42b0c0a5;
          auVar69._0_8_ = 0x42b0c0a542b0c0a5;
          auVar69._12_4_ = 0x42b0c0a5;
          auVar69._16_4_ = 0x42b0c0a5;
          auVar69._20_4_ = 0x42b0c0a5;
          auVar69._24_4_ = 0x42b0c0a5;
          auVar69._28_4_ = 0x42b0c0a5;
          auVar2 = vminps_avx(auVar2,auVar69);
          auVar70._8_4_ = 0xc2b0c0a5;
          auVar70._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar70._12_4_ = 0xc2b0c0a5;
          auVar70._16_4_ = 0xc2b0c0a5;
          auVar70._20_4_ = 0xc2b0c0a5;
          auVar70._24_4_ = 0xc2b0c0a5;
          auVar70._28_4_ = 0xc2b0c0a5;
          auVar1 = vmaxps_avx(auVar2,auVar70);
          auVar71._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
          auVar71._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
          auVar71._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
          auVar71._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
          auVar71._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
          auVar71._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
          auVar71._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
          auVar71._28_4_ = 0xc2afc0a5;
          auVar28 = vroundps_avx(auVar71,1);
          auVar2 = vcmpps_avx(auVar71,auVar28,1);
          auVar2 = vandps_avx(auVar105,auVar2);
          auVar2 = vsubps_avx(auVar28,auVar2);
          auVar7._4_4_ = auVar2._4_4_ * 0.6931472;
          auVar7._0_4_ = auVar2._0_4_ * 0.6931472;
          auVar7._8_4_ = auVar2._8_4_ * 0.6931472;
          auVar7._12_4_ = auVar2._12_4_ * 0.6931472;
          auVar7._16_4_ = auVar2._16_4_ * 0.6931472;
          auVar7._20_4_ = auVar2._20_4_ * 0.6931472;
          auVar7._24_4_ = auVar2._24_4_ * 0.6931472;
          auVar7._28_4_ = auVar28._28_4_;
          auVar1 = vsubps_avx(auVar1,auVar7);
          fVar19 = auVar1._0_4_;
          fVar31 = auVar1._4_4_;
          fVar33 = auVar1._8_4_;
          fVar35 = auVar1._12_4_;
          fVar74 = auVar1._16_4_;
          fVar75 = auVar1._20_4_;
          fVar76 = auVar1._24_4_;
          auVar57._0_4_ = (int)auVar2._0_4_;
          auVar57._4_4_ = (int)auVar2._4_4_;
          auVar57._8_4_ = (int)auVar2._8_4_;
          auVar57._12_4_ = (int)auVar2._12_4_;
          auVar72._16_4_ = (int)auVar2._16_4_;
          auVar72._0_16_ = auVar57;
          auVar72._20_4_ = (int)auVar2._20_4_;
          auVar72._24_4_ = (int)auVar2._24_4_;
          auVar72._28_4_ = (int)auVar2._28_4_;
          auVar108 = vpslld_avx(auVar57,0x17);
          auVar56 = vpslld_avx(auVar72._16_16_,0x17);
          auVar56 = vpaddd_avx(auVar121,auVar56);
          auVar108 = vpaddd_avx(auVar121,auVar108);
          auVar52._0_4_ =
               (fVar19 + 1.0 +
               fVar19 * fVar19 *
               (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar108._0_4_ + 1.0;
          auVar52._4_4_ =
               (fVar31 + 1.0 +
               fVar31 * fVar31 *
               (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar108._4_4_ + 1.0;
          auVar52._8_4_ =
               (fVar33 + 1.0 +
               fVar33 * fVar33 *
               (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                 0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar108._8_4_ + 1.0;
          auVar52._12_4_ =
               (fVar35 + 1.0 +
               fVar35 * fVar35 *
               (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar108._12_4_ + 1.0;
          auVar52._16_4_ =
               (fVar74 + 1.0 +
               fVar74 * fVar74 *
               (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5)) * auVar56._0_4_ + 1.0;
          auVar52._20_4_ =
               (fVar75 + 1.0 +
               fVar75 * fVar75 *
               (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5)) * auVar56._4_4_ + 1.0;
          auVar52._24_4_ =
               (fVar76 + 1.0 +
               fVar76 * fVar76 *
               (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar56._8_4_ + 1.0;
          auVar52._28_4_ = auVar1._28_4_ + 1.0 + auVar28._28_4_ + 1.0;
          auVar2 = vrcpps_avx(auVar52);
          fVar19 = auVar2._0_4_;
          fVar31 = auVar2._4_4_;
          fVar33 = auVar2._8_4_;
          fVar35 = auVar2._12_4_;
          fVar74 = auVar2._16_4_;
          fVar75 = auVar2._20_4_;
          fVar76 = auVar2._24_4_;
          auVar8._4_4_ = auVar52._4_4_ * (fVar31 + fVar31);
          auVar8._0_4_ = auVar52._0_4_ * (fVar19 + fVar19);
          auVar8._8_4_ = auVar52._8_4_ * (fVar33 + fVar33);
          auVar8._12_4_ = auVar52._12_4_ * (fVar35 + fVar35);
          auVar8._16_4_ = auVar52._16_4_ * (fVar74 + fVar74);
          auVar8._20_4_ = auVar52._20_4_ * (fVar75 + fVar75);
          auVar8._24_4_ = auVar52._24_4_ * (fVar76 + fVar76);
          auVar8._28_4_ = auVar52._28_4_;
          auVar89._8_4_ = 0x40000000;
          auVar89._0_8_ = 0x4000000040000000;
          auVar89._12_4_ = 0x40000000;
          auVar89._16_4_ = 0x40000000;
          auVar89._20_4_ = 0x40000000;
          auVar89._24_4_ = 0x40000000;
          auVar89._28_4_ = 0x40000000;
          auVar2 = vsubps_avx(auVar89,auVar8);
          local_58 = auVar82._0_4_;
          fStack_54 = auVar82._4_4_;
          fStack_50 = auVar82._8_4_;
          fStack_4c = auVar82._12_4_;
          fStack_48 = auVar82._16_4_;
          fStack_44 = auVar82._20_4_;
          fStack_40 = auVar82._24_4_;
          auVar9._4_4_ = (fVar31 + fVar31 + -1.0 + fVar31 * auVar2._4_4_) * fStack_54;
          auVar9._0_4_ = (fVar19 + fVar19 + -1.0 + fVar19 * auVar2._0_4_) * local_58;
          auVar9._8_4_ = (fVar33 + fVar33 + -1.0 + fVar33 * auVar2._8_4_) * fStack_50;
          auVar9._12_4_ = (fVar35 + fVar35 + -1.0 + fVar35 * auVar2._12_4_) * fStack_4c;
          auVar9._16_4_ = (fVar74 + fVar74 + -1.0 + fVar74 * auVar2._16_4_) * fStack_48;
          auVar9._20_4_ = (fVar75 + fVar75 + -1.0 + fVar75 * auVar2._20_4_) * fStack_44;
          auVar9._24_4_ = (fVar76 + fVar76 + -1.0 + fVar76 * auVar2._24_4_) * fStack_40;
          auVar9._28_4_ = 0x39506967;
          *pauVar17 = auVar9;
          pauVar17 = pauVar17 + 1;
          iVar10 = iVar10 + 8;
          uVar14 = uVar15 & 0xfffffff8;
        } while (iVar10 < (int)uVar15);
      }
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      uVar12 = uVar14 | 3;
      while ((int)uVar12 < (int)uVar15) {
        auVar56 = *(undefined1 (*) [16])*pauVar17;
        auVar101._8_4_ = 0x42b0c0a5;
        auVar101._0_8_ = 0x42b0c0a542b0c0a5;
        auVar101._12_4_ = 0x42b0c0a5;
        auVar108 = vminps_avx(auVar101,auVar56);
        auVar102._8_4_ = 0xc2b0c0a5;
        auVar102._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar102._12_4_ = 0xc2b0c0a5;
        auVar94 = vmaxps_avx(auVar102,auVar108);
        auVar25._8_4_ = 0x3f000000;
        auVar25._0_8_ = 0x3f0000003f000000;
        auVar25._12_4_ = 0x3f000000;
        auVar58._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
        auVar58._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
        auVar58._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
        auVar58._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
        auVar77._0_4_ = (int)auVar58._0_4_;
        auVar77._4_4_ = (int)auVar58._4_4_;
        auVar77._8_4_ = (int)auVar58._8_4_;
        auVar77._12_4_ = (int)auVar58._12_4_;
        auVar109 = vcvtdq2ps_avx(auVar77);
        auVar108 = vcmpps_avx(auVar58,auVar109,1);
        auVar108 = vandps_avx(auVar108,auVar95);
        auVar108 = vsubps_avx(auVar109,auVar108);
        auVar78._0_4_ = auVar108._0_4_ * 0.6931472;
        auVar78._4_4_ = auVar108._4_4_ * 0.6931472;
        auVar78._8_4_ = auVar108._8_4_ * 0.6931472;
        auVar78._12_4_ = auVar108._12_4_ * 0.6931472;
        auVar109 = vsubps_avx(auVar94,auVar78);
        fVar19 = auVar109._0_4_;
        fVar31 = auVar109._4_4_;
        fVar33 = auVar109._8_4_;
        fVar35 = auVar109._12_4_;
        auVar59._0_4_ = (int)auVar108._0_4_;
        auVar59._4_4_ = (int)auVar108._4_4_;
        auVar59._8_4_ = (int)auVar108._8_4_;
        auVar59._12_4_ = (int)auVar108._12_4_;
        auVar108 = vpslld_avx(auVar59,0x17);
        auVar108 = vpaddd_avx(auVar108,auVar95);
        auVar43._0_4_ =
             (fVar19 + 1.0 +
             fVar19 * fVar19 *
             (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
               0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar108._0_4_ + 1.0;
        auVar43._4_4_ =
             (fVar31 + 1.0 +
             fVar31 * fVar31 *
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar108._4_4_ + 1.0;
        auVar43._8_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar108._8_4_ + 1.0;
        auVar43._12_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar108._12_4_ + 1.0;
        auVar60._8_4_ = 0x800000;
        auVar60._0_8_ = 0x80000000800000;
        auVar60._12_4_ = 0x800000;
        auVar108 = vmaxps_avx(auVar43,auVar60);
        auVar109 = vpsrld_avx(auVar108,0x17);
        auVar86._8_4_ = 0xffffff82;
        auVar86._0_8_ = 0xffffff82ffffff82;
        auVar86._12_4_ = 0xffffff82;
        auVar109 = vpaddd_avx(auVar109,auVar86);
        auVar87._8_4_ = 0x807fffff;
        auVar87._0_8_ = 0x807fffff807fffff;
        auVar87._12_4_ = 0x807fffff;
        auVar108 = vandps_avx(auVar108,auVar87);
        auVar98 = vorps_avx(auVar108,auVar25);
        auVar94 = vcvtdq2ps_avx(auVar109);
        auVar88._8_4_ = 0x3f3504f3;
        auVar88._0_8_ = 0x3f3504f33f3504f3;
        auVar88._12_4_ = 0x3f3504f3;
        auVar109 = vcmpps_avx(auVar98,auVar88,1);
        auVar108 = vandps_avx(auVar109,auVar98);
        fVar19 = auVar98._0_4_ + -1.0 + auVar108._0_4_;
        fVar31 = auVar98._4_4_ + -1.0 + auVar108._4_4_;
        fVar33 = auVar98._8_4_ + -1.0 + auVar108._8_4_;
        fVar35 = auVar98._12_4_ + -1.0 + auVar108._12_4_;
        auVar108 = vandps_avx(auVar109,auVar95);
        auVar109 = vsubps_avx(auVar94,auVar108);
        auVar108 = vcmpps_avx(auVar43,_DAT_00513470,2);
        auVar61._0_4_ =
             (auVar109._0_4_ * 0.6931472 + fVar19 +
             fVar19 * fVar19 *
             (((((((((fVar19 * 0.070376836 + -0.1151461) * fVar19 + 0.116769984) * fVar19 +
                   -0.12420141) * fVar19 + 0.14249323) * fVar19 + -0.16668057) * fVar19 + 0.20000714
                ) * fVar19 + -0.24999994) * fVar19 + 0.3333333) * fVar19 + -0.5)) * -2.0;
        auVar61._4_4_ =
             (auVar109._4_4_ * 0.6931472 + fVar31 +
             fVar31 * fVar31 *
             (((((((((fVar31 * 0.070376836 + -0.1151461) * fVar31 + 0.116769984) * fVar31 +
                   -0.12420141) * fVar31 + 0.14249323) * fVar31 + -0.16668057) * fVar31 + 0.20000714
                ) * fVar31 + -0.24999994) * fVar31 + 0.3333333) * fVar31 + -0.5)) * -2.0;
        auVar61._8_4_ =
             (auVar109._8_4_ * 0.6931472 + fVar33 +
             fVar33 * fVar33 *
             (((((((((fVar33 * 0.070376836 + -0.1151461) * fVar33 + 0.116769984) * fVar33 +
                   -0.12420141) * fVar33 + 0.14249323) * fVar33 + -0.16668057) * fVar33 + 0.20000714
                ) * fVar33 + -0.24999994) * fVar33 + 0.3333333) * fVar33 + -0.5)) * -2.0;
        auVar61._12_4_ =
             (auVar109._12_4_ * 0.6931472 + fVar35 +
             fVar35 * fVar35 *
             (((((((((fVar35 * 0.070376836 + -0.1151461) * fVar35 + 0.116769984) * fVar35 +
                   -0.12420141) * fVar35 + 0.14249323) * fVar35 + -0.16668057) * fVar35 + 0.20000714
                ) * fVar35 + -0.24999994) * fVar35 + 0.3333333) * fVar35 + -0.5)) * -2.0;
        auVar79._8_4_ = 0x7fffffff;
        auVar79._0_8_ = 0x7fffffff7fffffff;
        auVar79._12_4_ = 0x7fffffff;
        auVar108 = vblendvps_avx(auVar61,auVar79,auVar108);
        auVar108 = vminps_avx(auVar101,auVar108);
        auVar94 = vmaxps_avx(auVar102,auVar108);
        auVar62._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
        auVar62._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
        auVar62._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
        auVar62._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
        auVar80._0_4_ = (int)auVar62._0_4_;
        auVar80._4_4_ = (int)auVar62._4_4_;
        auVar80._8_4_ = (int)auVar62._8_4_;
        auVar80._12_4_ = (int)auVar62._12_4_;
        auVar109 = vcvtdq2ps_avx(auVar80);
        auVar108 = vcmpps_avx(auVar62,auVar109,1);
        auVar108 = vandps_avx(auVar108,auVar95);
        auVar108 = vsubps_avx(auVar109,auVar108);
        auVar81._0_4_ = auVar108._0_4_ * 0.6931472;
        auVar81._4_4_ = auVar108._4_4_ * 0.6931472;
        auVar81._8_4_ = auVar108._8_4_ * 0.6931472;
        auVar81._12_4_ = auVar108._12_4_ * 0.6931472;
        auVar109 = vsubps_avx(auVar94,auVar81);
        fVar19 = auVar109._0_4_;
        fVar31 = auVar109._4_4_;
        fVar33 = auVar109._8_4_;
        fVar35 = auVar109._12_4_;
        auVar63._0_4_ = (int)auVar108._0_4_;
        auVar63._4_4_ = (int)auVar108._4_4_;
        auVar63._8_4_ = (int)auVar108._8_4_;
        auVar63._12_4_ = (int)auVar108._12_4_;
        auVar108 = vpslld_avx(auVar63,0x17);
        auVar108 = vpaddd_avx(auVar108,auVar95);
        auVar44._0_4_ =
             (fVar19 + 1.0 +
             fVar19 * fVar19 *
             (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
               0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar108._0_4_ + 1.0;
        auVar44._4_4_ =
             (fVar31 + 1.0 +
             fVar31 * fVar31 *
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar108._4_4_ + 1.0;
        auVar44._8_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar108._8_4_ + 1.0;
        auVar44._12_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar108._12_4_ + 1.0;
        auVar108 = vrcpps_avx(auVar44);
        fVar19 = auVar108._0_4_;
        fVar31 = auVar108._4_4_;
        fVar33 = auVar108._8_4_;
        fVar35 = auVar108._12_4_;
        auVar45._0_4_ = auVar44._0_4_ * (fVar19 + fVar19);
        auVar45._4_4_ = auVar44._4_4_ * (fVar31 + fVar31);
        auVar45._8_4_ = auVar44._8_4_ * (fVar33 + fVar33);
        auVar45._12_4_ = auVar44._12_4_ * (fVar35 + fVar35);
        auVar26._8_4_ = 0x40000000;
        auVar26._0_8_ = 0x4000000040000000;
        auVar26._12_4_ = 0x40000000;
        auVar108 = vsubps_avx(auVar26,auVar45);
        local_58 = auVar56._0_4_;
        fStack_54 = auVar56._4_4_;
        fStack_50 = auVar56._8_4_;
        fStack_4c = auVar56._12_4_;
        auVar27._0_4_ = (fVar19 + fVar19 + -1.0 + fVar19 * auVar108._0_4_) * local_58;
        auVar27._4_4_ = (fVar31 + fVar31 + -1.0 + fVar31 * auVar108._4_4_) * fStack_54;
        auVar27._8_4_ = (fVar33 + fVar33 + -1.0 + fVar33 * auVar108._8_4_) * fStack_50;
        auVar27._12_4_ = (fVar35 + fVar35 + -1.0 + fVar35 * auVar108._12_4_) * fStack_4c;
        *(undefined1 (*) [16])*pauVar17 = auVar27;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        uVar12 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
      if (uVar15 - uVar14 != 0 && (int)uVar14 <= (int)uVar15) {
        lVar18 = 0;
        do {
          fVar19 = *(float *)(*pauVar17 + lVar18 * 4);
          fVar31 = expf(fVar19);
          fVar31 = logf(fVar31 + 1.0);
          fVar31 = tanhf(fVar31);
          *(float *)(*pauVar17 + lVar18 * 4) = fVar31 * fVar19;
          lVar18 = lVar18 + 1;
        } while (uVar15 - uVar14 != (int)lVar18);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar16);
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}